

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngtrans.c
# Opt level: O0

void png_do_packswap(png_row_infop row_info,png_bytep row)

{
  size_t sVar1;
  png_byte *local_30;
  png_const_bytep table;
  png_const_bytep end;
  png_bytep rp;
  png_bytep row_local;
  png_row_infop row_info_local;
  
  if (row_info->bit_depth < 8) {
    sVar1 = row_info->rowbytes;
    end = row;
    if (row_info->bit_depth == '\x01') {
      local_30 = "";
    }
    else if (row_info->bit_depth == '\x02') {
      local_30 = "";
    }
    else {
      if (row_info->bit_depth != '\x04') {
        return;
      }
      local_30 = "";
    }
    for (; end < row + sVar1; end = end + 1) {
      *end = local_30[*end];
    }
  }
  return;
}

Assistant:

void /* PRIVATE */
png_do_packswap(png_row_infop row_info, png_bytep row)
{
   png_debug(1, "in png_do_packswap");

   if (row_info->bit_depth < 8)
   {
      png_bytep rp;
      png_const_bytep end, table;

      end = row + row_info->rowbytes;

      if (row_info->bit_depth == 1)
         table = onebppswaptable;

      else if (row_info->bit_depth == 2)
         table = twobppswaptable;

      else if (row_info->bit_depth == 4)
         table = fourbppswaptable;

      else
         return;

      for (rp = row; rp < end; rp++)
         *rp = table[*rp];
   }
}